

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_tar.c
# Opt level: O1

int64_t gnu_sparse_10_atol(archive_read *a,tar *tar,int64_t *remaining,size_t *unconsumed)

{
  char cVar1;
  long lVar2;
  char *pcVar3;
  void *pvVar4;
  archive_string *paVar5;
  archive_string *as;
  size_t sVar6;
  long lVar7;
  int error_number;
  size_t s;
  long lVar8;
  char *unaff_R14;
  size_t local_58;
  archive_read *local_50;
  char *local_48;
  long *local_40;
  archive_string *local_38;
  
  as = &tar->line;
  local_50 = a;
  local_40 = remaining;
  local_38 = as;
  do {
    lVar8 = *local_40;
    if (99 < lVar8) {
      lVar8 = 100;
    }
    if (*unconsumed != 0) {
      __archive_read_consume(a,*unconsumed);
      *unconsumed = 0;
    }
    pcVar3 = (char *)__archive_read_ahead(a,1,(ssize_t *)&local_58);
    s = local_58;
    if ((long)local_58 < 1) {
      sVar6 = 0xffffffffffffffe2;
      a = local_50;
    }
    else {
      pvVar4 = memchr(pcVar3,10,local_58);
      a = local_50;
      if (pvVar4 == (void *)0x0) {
        *unconsumed = s;
        local_48 = unaff_R14;
        if ((long)s <= lVar8) {
          pvVar4 = (void *)0x0;
          sVar6 = 0;
          do {
            paVar5 = archive_string_ensure(as,s);
            if (paVar5 == (archive_string *)0x0) {
              error_number = 0xc;
              pcVar3 = "Can\'t allocate working buffer";
              goto LAB_0015c8aa;
            }
            memcpy(as->s + sVar6,pcVar3,local_58);
            a = local_50;
            if (*unconsumed != 0) {
              __archive_read_consume(local_50,*unconsumed);
              *unconsumed = 0;
            }
            sVar6 = sVar6 + local_58;
            if (pvVar4 != (void *)0x0) {
              unaff_R14 = as->s;
              goto LAB_0015c8e3;
            }
            pcVar3 = (char *)__archive_read_ahead(a,1,(ssize_t *)&local_58);
            if ((long)local_58 < 1) {
              sVar6 = 0xffffffffffffffe2;
              unaff_R14 = local_48;
              a = local_50;
              goto LAB_0015c8e3;
            }
            pvVar4 = memchr(pcVar3,10,local_58);
            if (pvVar4 != (void *)0x0) {
              local_58 = (long)pvVar4 + (1 - (long)pcVar3);
            }
            *unconsumed = local_58;
            s = local_58 + sVar6;
          } while ((long)s <= lVar8);
        }
        error_number = 0x54;
        pcVar3 = "Line too long";
LAB_0015c8aa:
        a = local_50;
        archive_set_error(&local_50->archive,error_number,pcVar3);
        unaff_R14 = local_48;
      }
      else {
        sVar6 = (long)pvVar4 + (1 - (long)pcVar3);
        local_58 = sVar6;
        if ((long)sVar6 <= lVar8) {
          *unconsumed = sVar6;
          unaff_R14 = pcVar3;
          goto LAB_0015c8e3;
        }
        archive_set_error(&local_50->archive,0x54,"Line too long");
      }
      sVar6 = 0xffffffffffffffe2;
    }
LAB_0015c8e3:
    if ((long)sVar6 < 1) {
      return -0x1e;
    }
    *local_40 = *local_40 - sVar6;
    if (*unaff_R14 != '#') {
      lVar7 = sVar6 + 1;
      lVar8 = 0;
      while( true ) {
        cVar1 = *unaff_R14;
        if (cVar1 == '\n') {
          return lVar8;
        }
        if ((byte)(cVar1 - 0x3aU) < 0xf6) break;
        lVar2 = 0x7fffffffffffffff;
        if (lVar8 < 0xccccccccccccccd) {
          lVar2 = 0x7fffffffffffffff;
          if (lVar8 != 0xccccccccccccccc || (byte)(cVar1 - 0x30U) < 8) {
            lVar2 = (ulong)(byte)(cVar1 - 0x30U) + lVar8 * 10;
          }
        }
        lVar8 = lVar2;
        unaff_R14 = unaff_R14 + 1;
        lVar7 = lVar7 + -1;
        if (lVar7 < 2) {
          return -0x14;
        }
      }
      return -0x14;
    }
  } while( true );
}

Assistant:

static int64_t
gnu_sparse_10_atol(struct archive_read *a, struct tar *tar,
    int64_t *remaining, size_t *unconsumed)
{
	int64_t l, limit, last_digit_limit;
	const char *p;
	ssize_t bytes_read;
	int base, digit;

	base = 10;
	limit = INT64_MAX / base;
	last_digit_limit = INT64_MAX % base;

	/*
	 * Skip any lines starting with '#'; GNU tar specs
	 * don't require this, but they should.
	 */
	do {
		bytes_read = readline(a, tar, &p,
			(ssize_t)tar_min(*remaining, 100), unconsumed);
		if (bytes_read <= 0)
			return (ARCHIVE_FATAL);
		*remaining -= bytes_read;
	} while (p[0] == '#');

	l = 0;
	while (bytes_read > 0) {
		if (*p == '\n')
			return (l);
		if (*p < '0' || *p >= '0' + base)
			return (ARCHIVE_WARN);
		digit = *p - '0';
		if (l > limit || (l == limit && digit > last_digit_limit))
			l = INT64_MAX; /* Truncate on overflow. */
		else
			l = (l * base) + digit;
		p++;
		bytes_read--;
	}
	/* TODO: Error message. */
	return (ARCHIVE_WARN);
}